

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O2

void buildDoGPyramid(vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                     *scaleSpace,
                    vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                    *dogScaleSpace)

{
  long lVar1;
  long lVar2;
  vector<cv::Mat,_std::allocator<cv::Mat>_> tmpDogScale;
  Mat tmp;
  Mat local_190 [3];
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    tmpDogScale.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tmpDogScale.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tmpDogScale.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar2 = 0x60; lVar2 != 0x1e0; lVar2 = lVar2 + 0x60) {
      cv::operator-(local_190,
                    (Mat *)(*(long *)&(scaleSpace->
                                      super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[lVar1].
                                      super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                                      super__Vector_impl_data + lVar2));
      cv::MatExpr::operator_cast_to_Mat(&tmp,(MatExpr *)local_190);
      cv::MatExpr::~MatExpr((MatExpr *)local_190);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back(&tmpDogScale,&tmp);
      cv::Mat::~Mat(&tmp);
    }
    std::
    vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
    ::push_back(dogScaleSpace,&tmpDogScale);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&tmpDogScale);
  }
  return;
}

Assistant:

void buildDoGPyramid(const vector<vector<Mat> >& scaleSpace, vector<vector<Mat> >& dogScaleSpace){
    for(int i=0; i<octave; i++){
        vector<Mat> tmpDogScale;
        for(int j=0; j<octaveLayer-1; j++){
            Mat tmp = scaleSpace[i][j+1] - scaleSpace[i][j];
            // sharpen2(tmp,tmp);
            tmpDogScale.push_back(tmp);
        }
        dogScaleSpace.push_back(tmpDogScale);
    }
}